

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

char ** Qiniu_Region_Get_Up_Alternative_Hosts(Qiniu_Region *region,size_t *count)

{
  size_t *count_local;
  Qiniu_Region *region_local;
  
  if (count != (size_t *)0x0) {
    *count = 0;
  }
  if (region == (Qiniu_Region *)0x0) {
    region_local = (Qiniu_Region *)0x0;
  }
  else if (region->upService == (_Qiniu_Region_Service *)0x0) {
    region_local = (Qiniu_Region *)0x0;
  }
  else if ((region->upService->hosts == (char **)0x0) ||
          (region->upService->alternativeHostsCount == 0)) {
    region_local = (Qiniu_Region *)0x0;
  }
  else {
    if (count != (size_t *)0x0) {
      *count = region->upService->alternativeHostsCount;
    }
    region_local = (Qiniu_Region *)
                   (region->upService->hosts +
                   region->upService->acceleratedHostsCount + region->upService->preferredHostsCount
                   );
  }
  return &region_local->regionId;
}

Assistant:

const char *const *Qiniu_Region_Get_Up_Alternative_Hosts(Qiniu_Region *region, size_t *count)
{
    if (count != NULL)
    {
        *count = 0;
    }
    if (region == NULL)
    {
        return NULL;
    }
    if (region->upService == NULL)
    {
        return NULL;
    }
    if (region->upService->hosts == NULL || region->upService->alternativeHostsCount == 0)
    {
        return NULL;
    }
    if (count != NULL)
    {
        *count = region->upService->alternativeHostsCount;
    }
    return region->upService->hosts + region->upService->acceleratedHostsCount + region->upService->preferredHostsCount;
}